

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadtree.c
# Opt level: O0

void OrderTree(QuadTreeNode *Tree,int PostTree)

{
  long *plVar1;
  int in_ESI;
  long in_RDI;
  int c;
  Container **ITree;
  Container *PNext;
  Container *P;
  Container *NonObjects;
  Container *Objects;
  long *local_48;
  int local_3c;
  long *local_38;
  long *local_28;
  long *local_20;
  undefined8 in_stack_ffffffffffffffe8;
  long *plVar2;
  undefined4 in_stack_fffffffffffffff0;
  
  local_3c = 4;
  if (*(long *)(in_RDI + 0x38) == 0) {
    if (in_ESI == 0) {
      local_48 = (long *)(in_RDI + 0x28);
    }
    else {
      local_48 = (long *)(in_RDI + 0x30);
    }
    local_38 = local_48;
    if (*local_48 != 0) {
      local_20 = (long *)0x0;
      plVar1 = (long *)*local_48;
      plVar2 = (long *)0x0;
      while (local_28 = plVar1, local_28 != (long *)0x0) {
        plVar1 = (long *)*local_28;
        if ((int)local_28[1] == 1) {
          *local_28 = (long)plVar2;
          plVar2 = local_28;
        }
        else {
          *local_28 = (long)local_20;
          local_20 = local_28;
        }
      }
      *local_48 = (long)plVar2;
      for (; *local_38 != 0; local_38 = (long *)*local_38) {
      }
      *local_38 = (long)local_20;
    }
  }
  else {
    while (local_3c != 0) {
      OrderTree((QuadTreeNode *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
      local_3c = local_3c + -1;
    }
  }
  return;
}

Assistant:

void OrderTree(struct QuadTreeNode *Tree, int PostTree)
{
   struct Container *Objects, *NonObjects, *P, *PNext, **ITree;
   int c = 4;

   if (Tree->Children) {
      while (c--)
         OrderTree(&Tree->Children[c], PostTree);
   } else {
      ITree = PostTree ? &Tree->PostContents : &Tree->Contents;

      if (*ITree) {
         /* separate object and non-oject lists */
         Objects = NonObjects = NULL;
         P = *ITree;
         while (P) {
            PNext = P->Next;

            if (P->Type == OBJECT) {
               P->Next = Objects;
               Objects = P;
            } else {
               P->Next = NonObjects;
               NonObjects = P;
            }

            P = PNext;
         }

         /* now reintegrate lists - objects then non-objects */
         *ITree = Objects;
         while (*ITree)
            ITree = &(*ITree)->Next;
         *ITree = NonObjects;
      }
   }
}